

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

void __thiscall QPDF::showXRefTable(QPDF *this)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  _Base_ptr *this_00;
  undefined8 this_01;
  int iVar2;
  Pipeline *pPVar3;
  qpdf_offset_t i;
  _Base_ptr p_Var4;
  logic_error *this_02;
  undefined1 local_58 [32];
  _Base_ptr local_38;
  
  QPDFLogger::getInfo((QPDFLogger *)local_58,
                      SUB81(*(undefined8 *)
                             &((this->m)._M_t.
                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                               .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log,0))
  ;
  this_01 = local_58._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  p_Var4 = *(_Base_ptr *)((long)&(_Var1._M_head_impl)->xref_table + 0x18);
  local_38 = (_Base_ptr)((long)&(_Var1._M_head_impl)->xref_table + 8);
  if (p_Var4 != local_38) {
    do {
      QPDFObjGen::unparse_abi_cxx11_((string *)local_58,(QPDFObjGen *)(p_Var4 + 1),'/');
      pPVar3 = Pipeline::operator<<((Pipeline *)this_01,(string *)local_58);
      Pipeline::operator<<(pPVar3,": ");
      if ((element_type *)local_58._0_8_ != (element_type *)(local_58 + 0x10)) {
        operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
      }
      this_00 = &p_Var4[1]._M_parent;
      iVar2 = QPDFXRefEntry::getType((QPDFXRefEntry *)this_00);
      if (iVar2 == 1) {
        pPVar3 = Pipeline::operator<<((Pipeline *)this_01,"uncompressed; offset = ");
        i = QPDFXRefEntry::getOffset((QPDFXRefEntry *)this_00);
        Pipeline::operator<<(pPVar3,i);
      }
      else {
        if (iVar2 != 2) {
          this_02 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error
                    (this_02,"unknown cross-reference table type while showing xref_table");
          __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        QPDFLogger::getInfo((QPDFLogger *)local_58,
                            SUB81(*(undefined8 *)
                                   &((this->m)._M_t.
                                     super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                     .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                    log,0));
        pPVar3 = Pipeline::operator<<((Pipeline *)local_58._0_8_,"compressed; stream = ");
        iVar2 = QPDFXRefEntry::getObjStreamNumber((QPDFXRefEntry *)this_00);
        pPVar3 = Pipeline::operator<<(pPVar3,iVar2);
        pPVar3 = Pipeline::operator<<(pPVar3,", index = ");
        iVar2 = QPDFXRefEntry::getObjStreamIndex((QPDFXRefEntry *)this_00);
        Pipeline::operator<<(pPVar3,iVar2);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
        }
      }
      QPDFLogger::info(*(QPDFLogger **)
                        &((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log,"\n");
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != local_38);
  }
  return;
}

Assistant:

void
QPDF::showXRefTable()
{
    auto& cout = *m->log->getInfo();
    for (auto const& iter: m->xref_table) {
        QPDFObjGen const& og = iter.first;
        QPDFXRefEntry const& entry = iter.second;
        cout << og.unparse('/') << ": ";
        switch (entry.getType()) {
        case 1:
            cout << "uncompressed; offset = " << entry.getOffset();
            break;

        case 2:
            *m->log->getInfo() << "compressed; stream = " << entry.getObjStreamNumber()
                               << ", index = " << entry.getObjStreamIndex();
            break;

        default:
            throw std::logic_error("unknown cross-reference table type while showing xref_table");
            break;
        }
        m->log->info("\n");
    }
}